

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IlmThread.cpp
# Opt level: O0

void __thiscall IlmThread_2_5::Thread::~Thread(Thread *this)

{
  code *pcVar1;
  Thread *this_local;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

Thread::~Thread ()
{
    // hopefully the thread has basically exited and we are just
    // cleaning up, because run is a virtual function, so the v-table
    // has already been partly destroyed...
    if ( _thread.joinable () )
        _thread.join ();
}